

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

bool group_selective_undo_allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object new_group;
  Am_Value value;
  Am_Object local_38;
  Am_Object local_30;
  Am_Value local_28;
  Am_Value local_18;
  
  local_38.data = (Am_Object_Data *)0x0;
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x169,0);
  Am_Object::operator=(&local_38,pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x16d,1);
  Am_Value::operator=(&local_28,pAVar2);
  Am_Value::Am_Value(&local_18,&local_28);
  Am_Object::Am_Object(&local_30,&local_38);
  bVar1 = check_all_vis_and_in_group(&local_18,&local_30,false);
  Am_Object::~Am_Object(&local_30);
  Am_Value::~Am_Value(&local_18);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_38);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 group_selective_undo_allowed, (Am_Object command_obj))
{
  Am_Object new_group;
  Am_Value value;
  new_group = command_obj.Get(Am_VALUE);
  value = command_obj.Peek(Am_OBJECT_MODIFIED);
  return check_all_vis_and_in_group(value, new_group, false);
}